

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall minja::Context::get(Context *this,Value *key)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RDX;
  long in_RSI;
  Value *in_RDI;
  Value *unaff_retaddr;
  Value *in_stack_00000080;
  Value *in_stack_00000088;
  Value *in_stack_000000b0;
  Value *in_stack_000000b8;
  Value *this_00;
  Value *pVVar3;
  
  this_00 = in_RDI;
  pVVar3 = in_RDI;
  bVar1 = Value::contains(in_stack_000000b8,in_stack_000000b0);
  if (bVar1) {
    Value::at(in_stack_00000088,in_stack_00000080);
    Value::Value(unaff_retaddr,pVVar3);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x68));
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x29a362);
      (*peVar2->_vptr_Context[2])(this_00,peVar2,in_RDX);
    }
    else {
      Value::Value(this_00);
    }
  }
  return in_RDI;
}

Assistant:

virtual Value get(const Value & key) {
        if (values_.contains(key)) return values_.at(key);
        if (parent_) return parent_->get(key);
        return Value();
    }